

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O2

void Nf_ManElaBestMatch(Nf_Man_t *p,int iObj,int c,Nf_Mat_t *pRes,int Required)

{
  int iVar1;
  int *pCutSet;
  int iVar2;
  uint *pCut;
  
  pCutSet = Nf_ObjCutSet(p,iObj);
  *(undefined8 *)pRes = 0;
  pRes->D = 0x3fffffff;
  pRes->F = 3.4028235e+38;
  pCut = (uint *)(pCutSet + 1);
  for (iVar2 = 0; iVar2 < *pCutSet; iVar2 = iVar2 + 1) {
    iVar1 = Abc_Lit2Var(*pCut >> 5);
    if (iVar1 < p->vTt2Match->nSize) {
      Nf_ManElaBestMatchOne(p,iObj,c,(int *)pCut,pCutSet,pRes,Required);
    }
    pCut = pCut + (ulong)(*pCut & 0x1f) + 1;
  }
  return;
}

Assistant:

void Nf_ManElaBestMatch( Nf_Man_t * p, int iObj, int c, Nf_Mat_t * pRes, int Required )
{
    int k, * pCut, * pCutSet = Nf_ObjCutSet( p, iObj );
    memset( pRes, 0, sizeof(Nf_Mat_t) );
    pRes->D = SCL_INFINITY; pRes->F = FLT_MAX;
    Nf_SetForEachCut( pCutSet, pCut, k )
    {
        if ( Abc_Lit2Var(Nf_CutFunc(pCut)) >= Vec_WecSize(p->vTt2Match) )
            continue;
        Nf_ManElaBestMatchOne( p, iObj, c, pCut, pCutSet, pRes, Required );
    }
}